

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListViewPrivate::QListViewPrivate(QListViewPrivate *this)

{
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QListViewPrivate_0080dd30;
  this->commonListView = (QCommonListViewBase *)0x0;
  this->wrap = false;
  this->space = 0;
  (this->grid).wd = -1;
  *(undefined8 *)&(this->grid).ht = 0x1ffffffff;
  this->movement = Static;
  this->resizeMode = Fixed;
  this->layoutMode = SinglePass;
  this->viewMode = ListMode;
  this->field_0x56c = 0;
  (this->layoutBounds).x1 = 0;
  (this->layoutBounds).y1 = 0;
  (this->layoutBounds).x2 = -1;
  (this->layoutBounds).y2 = -1;
  (this->batchLayoutTimer).m_id = Invalid;
  (this->hiddenRows).q_hash.d = (Data *)0x0;
  this->column = 0;
  this->uniformItemSizes = false;
  (this->cachedItemSize).wd = -1;
  (this->cachedItemSize).ht = -1;
  this->batchSize = 100;
  (this->elasticBand).x1 = 0;
  (this->elasticBand).y1 = 0;
  (this->elasticBand).x2 = -1;
  (this->elasticBand).y2.m_i = -1;
  this->showElasticBand = false;
  (this->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  return;
}

Assistant:

QListViewPrivate::QListViewPrivate()
    : QAbstractItemViewPrivate(),
      commonListView(nullptr),
      wrap(false),
      space(0),
      flow(QListView::TopToBottom),
      movement(QListView::Static),
      resizeMode(QListView::Fixed),
      layoutMode(QListView::SinglePass),
      viewMode(QListView::ListMode),
      modeProperties(0),
      column(0),
      uniformItemSizes(false),
      batchSize(100),
      showElasticBand(false),
      itemAlignment(Qt::Alignment())
{
}